

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
asl::Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::Array
          (Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this,KeyVal *p,int n)

{
  ulong uVar1;
  ulong uVar2;
  
  alloc(this,n);
  uVar2 = 0;
  uVar1 = (ulong)(uint)n;
  if (n < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 * 0x20 != uVar2; uVar2 = uVar2 + 0x20) {
    Map<asl::String,_asl::Dic<asl::String>_>::KeyVal::operator=
              ((KeyVal *)((long)&(this->_a->key)._size + uVar2),
               (KeyVal *)((long)&(p->key)._size + uVar2));
  }
  return;
}

Assistant:

ASL_EXPLICIT Array(const T* p, int n) { alloc(n); for (int i = 0; i < n; i++) _a[i] = p[i]; }